

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateBuilderMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Type type;
  int iVar3;
  Options *pOVar4;
  Semantic local_434;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_430;
  string_view local_428;
  string_view local_418;
  string_view local_408;
  Options local_3f8;
  Semantic local_3a4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3a0;
  string_view local_398;
  string_view local_388;
  string_view local_378;
  Options local_368;
  Semantic local_314;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_310;
  string_view local_308;
  string_view local_2f8;
  string_view local_2e8;
  Options local_2d8;
  Semantic local_284;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_280;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  Options local_248;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1f0;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  Options local_1b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8 [2];
  Options local_88;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "private $field_list_type$ $name$_ = $empty_list$;\nprivate void ensure$capitalized_name$IsMutable() {\n  if (!$name$_.isModifiable()) {\n    $name$_ = makeMutableCopy($name$_);\n  }\n  $set_has_field_bit_builder$\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_28);
  type = GetType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  iVar3 = FixedSize(type);
  pPVar2 = local_18;
  if (iVar3 != -1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "private void ensure$capitalized_name$IsMutable(int capacity) {\n  if (!$name$_.isModifiable()) {\n    $name$_ = makeMutableCopy($name$_, capacity);\n  }\n  $set_has_field_bit_builder$\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_38);
  }
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_88,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_GETTER,&local_88,false,false,false);
  java::Options::~Options(&local_88);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a8,
             "$deprecation$public java.util.List<$boxed_type$>\n    ${$get$capitalized_name$List$}$() {\n  $name$_.makeImmutable();\n  return $name$_;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_a8[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_b8,local_c8,pFVar1,local_d0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_128,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_128,false,false,false);
  java::Options::~Options(&local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,
             "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_160);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_148,local_158,pFVar1,local_160);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_1b8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_1b8,false,false,false);
  java::Options::~Options(&local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c8,
             "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $repeated_get$(index);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_1c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1f0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1d8,local_1e8,pFVar1,local_1f0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_248,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_SETTER,&local_248,true,false,false);
  java::Options::~Options(&local_248);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, $type$ value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $repeated_set$(index, value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_258);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  local_284 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_280,&local_284);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_268,local_278,pFVar1,local_280);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_2d8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_2d8,true,false,false);
  java::Options::~Options(&local_2d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,
             "$deprecation$public Builder ${$add$capitalized_name$$}$($type$ value) {\n  $null_check$\n  ensure$capitalized_name$IsMutable();\n  $repeated_add$(value);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_2e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  local_314 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_310,&local_314);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2f8,local_308,pFVar1,local_310);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_368,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_MULTI_ADDER,&local_368,true,false,false);
  java::Options::~Options(&local_368);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_378,
             "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<? extends $boxed_type$> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n      values, $name$_);\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_378);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  local_3a4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3a0,&local_3a4);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_388,local_398,pFVar1,local_3a0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_3f8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_3f8,true,false,false);
  java::Options::~Options(&local_3f8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_408,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $name$_ = $empty_list$;\n  $clear_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_408);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_418,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_428,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  local_434 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_430,&local_434);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_418,local_428,pFVar1,local_430);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // We use a ProtobufArrayList because it starts as a mutable list that can be
  // switched to immutable when references are handed out. This allows copy-free
  // sharing. A bit in the bitfield tracks whether there are any items in the
  // list. The presence bit allows us to skip work on blocks of 32 fields by
  // by checking if the entire bit-field int == 0 (none of the fields are
  // present).
  printer->Print(variables_,
                 "private $field_list_type$ $name$_ = $empty_list$;\n"
                 "private void ensure$capitalized_name$IsMutable() {\n"
                 "  if (!$name$_.isModifiable()) {\n"
                 "    $name$_ = makeMutableCopy($name$_);\n"
                 "  }\n"
                 "  $set_has_field_bit_builder$\n"
                 "}\n");
  if (FixedSize(GetType(descriptor_)) != -1) {
    printer->Print(
        variables_,
        "private void ensure$capitalized_name$IsMutable(int capacity) {\n"
        "  if (!$name$_.isModifiable()) {\n"
        "    $name$_ = makeMutableCopy($name$_, capacity);\n"
        "  }\n"
        "  $set_has_field_bit_builder$\n"
        "}\n");
  }

  // Note:  We return an unmodifiable list because otherwise the caller
  //   could hold on to the returned list and modify it after the message
  //   has been built, thus mutating the message which is supposed to be
  //   immutable.
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  $name$_.makeImmutable();\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $repeated_get$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, $type$ value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_set$(index, value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$add$capitalized_name$$}$($type$ value) {\n"
                 "  $null_check$\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $repeated_add$(value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<? extends $boxed_type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.Builder.addAll(\n"
                 "      values, $name$_);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $name$_ = $empty_list$;\n"
      "  $clear_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}